

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

void xml_end(void *userData,char *name)

{
  xar *xar;
  xar_file *pxVar1;
  int iVar2;
  char *pcVar3;
  
  xar = (xar *)**(undefined8 **)((long)userData + 0x818);
  switch(xar->xmlsts) {
  case XAR:
    iVar2 = strcmp(name,"xar");
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = INIT;
    return;
  case TOC:
    iVar2 = strcmp(name,"toc");
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = XAR;
    return;
  case TOC_CREATION_TIME:
    pcVar3 = "creation-time";
    goto LAB_0013e00c;
  case TOC_CHECKSUM:
    pcVar3 = "checksum";
LAB_0013e00c:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
LAB_0013e01f:
    xar->xmlsts = TOC;
    return;
  case TOC_CHECKSUM_OFFSET:
    pcVar3 = "offset";
    goto LAB_0013e0a9;
  case TOC_CHECKSUM_SIZE:
    pcVar3 = "size";
LAB_0013e0a9:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = TOC_CHECKSUM;
    return;
  case TOC_FILE:
    iVar2 = strcmp(name,"file");
    if (iVar2 != 0) {
      return;
    }
    pxVar1 = xar->file->parent;
    if (pxVar1 == (xar_file *)0x0) {
      xar->file = (xar_file *)0x0;
    }
    else {
      if ((xar->file->mode & 0xf000) == 0x4000) {
        pxVar1->subdirs = pxVar1->subdirs + 1;
      }
      xar->file = pxVar1;
      if (pxVar1 != (xar_file *)0x0) {
        return;
      }
    }
    goto LAB_0013e01f;
  case FILE_DATA:
    pcVar3 = "data";
    goto LAB_0013e26c;
  case FILE_DATA_LENGTH:
    pcVar3 = "length";
    goto LAB_0013e16a;
  case FILE_DATA_OFFSET:
    pcVar3 = "offset";
    goto LAB_0013e16a;
  case FILE_DATA_SIZE:
    pcVar3 = "size";
    goto LAB_0013e16a;
  case FILE_DATA_ENCODING:
    pcVar3 = "encoding";
    goto LAB_0013e16a;
  case FILE_DATA_A_CHECKSUM:
    pcVar3 = "archived-checksum";
    goto LAB_0013e16a;
  case FILE_DATA_E_CHECKSUM:
    pcVar3 = "extracted-checksum";
    goto LAB_0013e16a;
  case FILE_DATA_CONTENT:
    pcVar3 = "content";
LAB_0013e16a:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = FILE_DATA;
    return;
  case FILE_EA:
    iVar2 = strcmp(name,"ea");
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = TOC_FILE;
    xar->xattr = (xattr *)0x0;
    return;
  case FILE_EA_LENGTH:
    pcVar3 = "length";
    goto LAB_0013e210;
  case FILE_EA_OFFSET:
    pcVar3 = "offset";
    goto LAB_0013e210;
  case FILE_EA_SIZE:
    pcVar3 = "size";
    goto LAB_0013e210;
  case FILE_EA_ENCODING:
    pcVar3 = "encoding";
    goto LAB_0013e210;
  case FILE_EA_A_CHECKSUM:
    pcVar3 = "archived-checksum";
    goto LAB_0013e210;
  case FILE_EA_E_CHECKSUM:
    pcVar3 = "extracted-checksum";
    goto LAB_0013e210;
  case FILE_EA_NAME:
    pcVar3 = "name";
    goto LAB_0013e210;
  case FILE_EA_FSTYPE:
    pcVar3 = "fstype";
LAB_0013e210:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = FILE_EA;
    return;
  case FILE_CTIME:
    pcVar3 = "ctime";
    goto LAB_0013e26c;
  case FILE_MTIME:
    pcVar3 = "mtime";
    goto LAB_0013e26c;
  case FILE_ATIME:
    pcVar3 = "atime";
    goto LAB_0013e26c;
  case FILE_GROUP:
    pcVar3 = "group";
    goto LAB_0013e26c;
  case FILE_GID:
    pcVar3 = "gid";
    goto LAB_0013e26c;
  case FILE_USER:
    pcVar3 = "user";
    goto LAB_0013e26c;
  case FILE_UID:
    pcVar3 = "uid";
    goto LAB_0013e26c;
  case FILE_MODE:
    pcVar3 = "mode";
    goto LAB_0013e26c;
  case FILE_DEVICE:
    pcVar3 = "device";
    goto LAB_0013e26c;
  case FILE_DEVICE_MAJOR:
    pcVar3 = "GNU.sparse.major";
    goto LAB_0013df10;
  case FILE_DEVICE_MINOR:
    pcVar3 = "GNU.sparse.minor";
LAB_0013df10:
    iVar2 = strcmp(name,pcVar3 + 0xb);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = FILE_DEVICE;
    return;
  case FILE_DEVICENO:
    pcVar3 = "deviceno";
    goto LAB_0013e26c;
  case FILE_INODE:
    pcVar3 = "inode";
    goto LAB_0013e26c;
  case FILE_LINK:
    pcVar3 = "link";
    goto LAB_0013e26c;
  case FILE_TYPE:
    pcVar3 = "type";
    goto LAB_0013e26c;
  case FILE_NAME:
    pcVar3 = "name";
    goto LAB_0013e26c;
  case FILE_ACL:
    pcVar3 = "acl";
    goto LAB_0013e26c;
  case FILE_ACL_DEFAULT:
    pcVar3 = "default";
    goto LAB_0013e1de;
  case FILE_ACL_ACCESS:
    pcVar3 = "access";
    goto LAB_0013e1de;
  case FILE_ACL_APPLEEXTENDED:
    pcVar3 = "appleextended";
LAB_0013e1de:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = FILE_ACL;
    return;
  case FILE_FLAGS:
    pcVar3 = "flags";
    goto LAB_0013e26c;
  case FILE_FLAGS_USER_NODUMP:
    pcVar3 = "UserNoDump";
    goto LAB_0013e2af;
  case FILE_FLAGS_USER_IMMUTABLE:
    pcVar3 = "UserImmutable";
    goto LAB_0013e2af;
  case FILE_FLAGS_USER_APPEND:
    pcVar3 = "UserAppend";
    goto LAB_0013e2af;
  case FILE_FLAGS_USER_OPAQUE:
    pcVar3 = "UserOpaque";
    goto LAB_0013e2af;
  case FILE_FLAGS_USER_NOUNLINK:
    pcVar3 = "UserNoUnlink";
    goto LAB_0013e2af;
  case FILE_FLAGS_SYS_ARCHIVED:
    pcVar3 = "SystemArchived";
    goto LAB_0013e2af;
  case FILE_FLAGS_SYS_IMMUTABLE:
    pcVar3 = "SystemImmutable";
    goto LAB_0013e2af;
  case FILE_FLAGS_SYS_APPEND:
    pcVar3 = "SystemAppend";
    goto LAB_0013e2af;
  case FILE_FLAGS_SYS_NOUNLINK:
    pcVar3 = "SystemNoUnlink";
    goto LAB_0013e2af;
  case FILE_FLAGS_SYS_SNAPSHOT:
    pcVar3 = "SystemSnapshot";
LAB_0013e2af:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = FILE_FLAGS;
    return;
  case FILE_EXT2:
    pcVar3 = "ext2";
LAB_0013e26c:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    xar->xmlsts = TOC_FILE;
    return;
  case FILE_EXT2_SecureDeletion:
    pcVar3 = "SecureDeletion";
    break;
  case FILE_EXT2_Undelete:
    pcVar3 = "Undelete";
    break;
  case FILE_EXT2_Compress:
    pcVar3 = "Compress";
    break;
  case FILE_EXT2_Synchronous:
    pcVar3 = "Synchronous";
    break;
  case FILE_EXT2_Immutable:
    pcVar3 = "Immutable";
    break;
  case FILE_EXT2_AppendOnly:
    pcVar3 = "AppendOnly";
    break;
  case FILE_EXT2_NoDump:
    pcVar3 = "NoDump";
    break;
  case FILE_EXT2_NoAtime:
    pcVar3 = "NoAtime";
    break;
  case FILE_EXT2_CompDirty:
    pcVar3 = "CompDirty";
    break;
  case FILE_EXT2_CompBlock:
    pcVar3 = "CompBlock";
    break;
  case FILE_EXT2_NoCompBlock:
    pcVar3 = "NoCompBlock";
    break;
  case FILE_EXT2_CompError:
    pcVar3 = "CompError";
    break;
  case FILE_EXT2_BTree:
    pcVar3 = "BTree";
    break;
  case FILE_EXT2_HashIndexed:
    pcVar3 = "HashIndexed";
    break;
  case FILE_EXT2_iMagic:
    pcVar3 = "iMagic";
    break;
  case FILE_EXT2_Journaled:
    pcVar3 = "Journaled";
    break;
  case FILE_EXT2_NoTail:
    pcVar3 = "NoTail";
    break;
  case FILE_EXT2_DirSync:
    pcVar3 = "DirSync";
    break;
  case FILE_EXT2_TopDir:
    pcVar3 = "TopDir";
    break;
  case FILE_EXT2_Reserved:
    pcVar3 = "Reserved";
    break;
  case UNKNOWN:
    unknowntag_end(xar,name);
    return;
  default:
    goto switchD_0013de00_default;
  }
  iVar2 = strcmp(name,pcVar3);
  if (iVar2 == 0) {
    xar->xmlsts = FILE_EXT2;
  }
switchD_0013de00_default:
  return;
}

Assistant:

static void
xml_end(void *userData, const char *name)
{
	struct archive_read *a;
	struct xar *xar;

	a = (struct archive_read *)userData;
	xar = (struct xar *)(a->format->data);

#if DEBUG
	fprintf(stderr, "xml_end:[%s]\n", name);
#endif
	switch (xar->xmlsts) {
	case INIT:
		break;
	case XAR:
		if (strcmp(name, "xar") == 0)
			xar->xmlsts = INIT;
		break;
	case TOC:
		if (strcmp(name, "toc") == 0)
			xar->xmlsts = XAR;
		break;
	case TOC_CREATION_TIME:
		if (strcmp(name, "creation-time") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM:
		if (strcmp(name, "checksum") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_CHECKSUM_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_FILE:
		if (strcmp(name, "file") == 0) {
			if (xar->file->parent != NULL &&
			    ((xar->file->mode & AE_IFMT) == AE_IFDIR))
				xar->file->parent->subdirs++;
			xar->file = xar->file->parent;
			if (xar->file == NULL)
				xar->xmlsts = TOC;
		}
		break;
	case FILE_DATA:
		if (strcmp(name, "data") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DATA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_CONTENT:
		if (strcmp(name, "content") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_EA:
		if (strcmp(name, "ea") == 0) {
			xar->xmlsts = TOC_FILE;
			xar->xattr = NULL;
		}
		break;
	case FILE_EA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_FSTYPE:
		if (strcmp(name, "fstype") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_CTIME:
		if (strcmp(name, "ctime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MTIME:
		if (strcmp(name, "mtime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ATIME:
		if (strcmp(name, "atime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GROUP:
		if (strcmp(name, "group") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GID:
		if (strcmp(name, "gid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_USER:
		if (strcmp(name, "user") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_UID:
		if (strcmp(name, "uid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MODE:
		if (strcmp(name, "mode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE:
		if (strcmp(name, "device") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE_MAJOR:
		if (strcmp(name, "major") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICE_MINOR:
		if (strcmp(name, "minor") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICENO:
		if (strcmp(name, "deviceno") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_INODE:
		if (strcmp(name, "inode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_LINK:
		if (strcmp(name, "link") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_TYPE:
		if (strcmp(name, "type") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL:
		if (strcmp(name, "acl") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL_DEFAULT:
		if (strcmp(name, "default") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_ACCESS:
		if (strcmp(name, "access") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_APPLEEXTENDED:
		if (strcmp(name, "appleextended") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_FLAGS:
		if (strcmp(name, "flags") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_FLAGS_USER_NODUMP:
		if (strcmp(name, "UserNoDump") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_IMMUTABLE:
		if (strcmp(name, "UserImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_APPEND:
		if (strcmp(name, "UserAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_OPAQUE:
		if (strcmp(name, "UserOpaque") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_NOUNLINK:
		if (strcmp(name, "UserNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_ARCHIVED:
		if (strcmp(name, "SystemArchived") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_IMMUTABLE:
		if (strcmp(name, "SystemImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_APPEND:
		if (strcmp(name, "SystemAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_NOUNLINK:
		if (strcmp(name, "SystemNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_SNAPSHOT:
		if (strcmp(name, "SystemSnapshot") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_EXT2:
		if (strcmp(name, "ext2") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_EXT2_SecureDeletion:
		if (strcmp(name, "SecureDeletion") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Undelete:
		if (strcmp(name, "Undelete") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Compress:
		if (strcmp(name, "Compress") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Synchronous:
		if (strcmp(name, "Synchronous") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Immutable:
		if (strcmp(name, "Immutable") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_AppendOnly:
		if (strcmp(name, "AppendOnly") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoDump:
		if (strcmp(name, "NoDump") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoAtime:
		if (strcmp(name, "NoAtime") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompDirty:
		if (strcmp(name, "CompDirty") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompBlock:
		if (strcmp(name, "CompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoCompBlock:
		if (strcmp(name, "NoCompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompError:
		if (strcmp(name, "CompError") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_BTree:
		if (strcmp(name, "BTree") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_HashIndexed:
		if (strcmp(name, "HashIndexed") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_iMagic:
		if (strcmp(name, "iMagic") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Journaled:
		if (strcmp(name, "Journaled") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoTail:
		if (strcmp(name, "NoTail") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_DirSync:
		if (strcmp(name, "DirSync") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_TopDir:
		if (strcmp(name, "TopDir") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Reserved:
		if (strcmp(name, "Reserved") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case UNKNOWN:
		unknowntag_end(xar, name);
		break;
	}
}